

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O3

void readPrefs(void)

{
  Fl_Preferences opt_prefs;
  Fl_Preferences prefs;
  Fl_Preferences FStack_38;
  Fl_Preferences local_20;
  
  Fl_Preferences::Fl_Preferences(&local_20,SYSTEM,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&FStack_38,&local_20,"options");
  Fl_Preferences::get(&FStack_38,"ArrowFocus",opt[0] + 1,2);
  Fl_Preferences::get(&FStack_38,"VisibleFocus",opt[1] + 1,2);
  Fl_Preferences::get(&FStack_38,"DNDText",opt[2] + 1,2);
  Fl_Preferences::get(&FStack_38,"ShowTooltips",opt[3] + 1,2);
  Fl_Preferences::get(&FStack_38,"FNFCUsesGTK",opt[4] + 1,2);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&FStack_38);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_20);
  Fl_Preferences::Fl_Preferences(&local_20,USER,"fltk.org","fltk");
  Fl_Preferences::Fl_Preferences(&FStack_38,&local_20,"options");
  Fl_Preferences::get(&FStack_38,"ArrowFocus",opt[0],2);
  Fl_Preferences::get(&FStack_38,"VisibleFocus",opt[1],2);
  Fl_Preferences::get(&FStack_38,"DNDText",opt[2],2);
  Fl_Preferences::get(&FStack_38,"ShowTooltips",opt[3],2);
  Fl_Preferences::get(&FStack_38,"FNFCUsesGTK",opt[4],2);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&FStack_38);
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&local_20);
  refreshUI();
  return;
}

Assistant:

static void readPrefs() {
  // read all preferences and refresh the GUI
  {
    Fl_Preferences prefs(Fl_Preferences::SYSTEM, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    opt_prefs.get("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][1], 2);
    opt_prefs.get("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][1], 2);
    opt_prefs.get("DNDText", opt[Fl::OPTION_DND_TEXT][1], 2);
    opt_prefs.get("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][1], 2);
    opt_prefs.get("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK ][1], 2);
  }
  {
    Fl_Preferences prefs(Fl_Preferences::USER, "fltk.org", "fltk");
    Fl_Preferences opt_prefs(prefs, "options");
    opt_prefs.get("ArrowFocus", opt[Fl::OPTION_ARROW_FOCUS][0], 2);
    opt_prefs.get("VisibleFocus", opt[Fl::OPTION_VISIBLE_FOCUS][0], 2);
    opt_prefs.get("DNDText", opt[Fl::OPTION_DND_TEXT][0], 2);
    opt_prefs.get("ShowTooltips", opt[Fl::OPTION_SHOW_TOOLTIPS][0], 2);
    opt_prefs.get("FNFCUsesGTK", opt[Fl::OPTION_FNFC_USES_GTK ][0], 2);
  }
  refreshUI();
}